

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os_linux.cpp
# Opt level: O3

FUNCTION_RETURN
parse_blkid(string *blkid_file_content,vector<DiskInfo,_std::allocator<DiskInfo>_> *diskInfos_out,
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           *disk_by_uuid)

{
  iterator __position;
  vector<DiskInfo,std::allocator<DiskInfo>> *this;
  int iVar1;
  long lVar2;
  uint extraout_EDX;
  uint extraout_EDX_00;
  uint out_size;
  int iVar3;
  string disk_sn;
  string disk_type;
  string label;
  string device;
  string cur_dev;
  DiskInfo diskInfo;
  string *local_618 [2];
  string local_608;
  vector<DiskInfo,std::allocator<DiskInfo>> *local_5e8;
  string local_5e0;
  string local_5c0;
  string local_5a0;
  char *local_580 [2];
  char local_570 [16];
  string local_560;
  anon_struct_1296_7_5326303c local_540;
  
  iVar3 = 0;
  local_608.field_2._8_8_ = disk_by_uuid;
  local_5e8 = (vector<DiskInfo,std::allocator<DiskInfo>> *)diskInfos_out;
  memset(&local_540,0,0x510);
  lVar2 = std::__cxx11::string::find((char *)blkid_file_content,0x43d89c,0);
  if (lVar2 != -1) {
    do {
      std::__cxx11::string::substr((ulong)&local_560,(ulong)blkid_file_content);
      local_540.id = iVar3;
      std::__cxx11::string::find_last_of((char *)&local_560,0x44609f,0xffffffffffffffff);
      std::__cxx11::string::substr((ulong)local_580,(ulong)&local_560);
      license::mstrlcpy(local_540.device,local_580[0],0x400);
      local_618[0] = &local_608;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_618,"PARTLABEL","");
      this = local_5e8;
      getAttribute(&local_5a0,&local_560,local_618[0]);
      if (local_618[0] != &local_608) {
        operator_delete(local_618[0]);
      }
      license::mstrlcpy(local_540.label,local_5a0._M_dataplus._M_p,0xff);
      local_618[0] = &local_608;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_618,"UUID","");
      getAttribute(&local_5e0,&local_560,local_618[0]);
      out_size = extraout_EDX;
      if (local_618[0] != &local_608) {
        operator_delete(local_618[0]);
        out_size = extraout_EDX_00;
      }
      parseUUID(local_5e0._M_dataplus._M_p,local_540.disk_sn,out_size);
      local_618[0] = &local_608;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_618,"TYPE","");
      getAttribute(&local_5c0,&local_560,local_618[0]);
      if (local_618[0] != &local_608) {
        operator_delete(local_618[0]);
      }
      local_618[0] = &local_608;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_618,local_5e0._M_dataplus._M_p,
                 local_5e0._M_dataplus._M_p + local_5e0._M_string_length);
      local_608.field_2._M_allocated_capacity._0_4_ = local_540.id;
      std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::allocator<std::pair<std::__cxx11::string_const,int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::_M_emplace<std::pair<std::__cxx11::string,int>>
                ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::allocator<std::pair<std::__cxx11::string_const,int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)local_608.field_2._8_8_,local_618);
      if (local_618[0] != &local_608) {
        operator_delete(local_618[0]);
      }
      local_540.label_initialized = true;
      local_540.sn_initialized = true;
      iVar1 = std::__cxx11::string::compare((char *)&local_5c0);
      local_540.preferred = iVar1 == 0;
      __position._M_current = *(anon_struct_1296_7_5326303c **)(this + 8);
      if (__position._M_current == *(anon_struct_1296_7_5326303c **)(this + 0x10)) {
        std::vector<DiskInfo,std::allocator<DiskInfo>>::_M_realloc_insert<DiskInfo_const&>
                  (this,__position,&local_540);
      }
      else {
        memcpy(__position._M_current,&local_540,0x510);
        *(long *)(this + 8) = *(long *)(this + 8) + 0x510;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5c0._M_dataplus._M_p != &local_5c0.field_2) {
        operator_delete(local_5c0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5e0._M_dataplus._M_p != &local_5e0.field_2) {
        operator_delete(local_5e0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5a0._M_dataplus._M_p != &local_5a0.field_2) {
        operator_delete(local_5a0._M_dataplus._M_p);
      }
      if (local_580[0] != local_570) {
        operator_delete(local_580[0]);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_560._M_dataplus._M_p != &local_560.field_2) {
        operator_delete(local_560._M_dataplus._M_p);
      }
      lVar2 = std::__cxx11::string::find((char *)blkid_file_content,0x43d89c,lVar2 + 1);
      iVar3 = iVar3 + 1;
    } while (lVar2 != -1);
  }
  return FUNC_RET_OK;
}

Assistant:

FUNCTION_RETURN parse_blkid(const std::string &blkid_file_content, std::vector<DiskInfo> &diskInfos_out,
							std::unordered_map<std::string, int> &disk_by_uuid) {
	DiskInfo diskInfo = {};
	int diskNum = 0;
	for (std::size_t oldpos = 0, pos = 0; (pos = blkid_file_content.find("</device>", oldpos)) != std::string::npos;
		 oldpos = pos + 1) {
		std::string cur_dev = blkid_file_content.substr(oldpos, pos);
		diskInfo.id = diskNum++;
		std::string device = cur_dev.substr(cur_dev.find_last_of(">") + 1);
		mstrlcpy(diskInfo.device, device.c_str(), MAX_PATH);
		std::string label = getAttribute(cur_dev, "PARTLABEL");
		mstrlcpy(diskInfo.label, label.c_str(), 255);
		std::string disk_sn = getAttribute(cur_dev, "UUID");
		parseUUID(disk_sn.c_str(), diskInfo.disk_sn, sizeof(diskInfo.disk_sn));
		std::string disk_type = getAttribute(cur_dev, "TYPE");
		disk_by_uuid.insert(std::pair<std::string, int>(disk_sn, diskInfo.id));
		diskInfo.label_initialized = true;
		diskInfo.sn_initialized = true;
		// unlikely that somebody put the swap on a removable disk.
		// this is a first rough guess on what can be a preferred disk for blkid devices
		// just in case /etc/fstab can't be accessed or it is not up to date.
		diskInfo.preferred = (disk_type == "swap");
		diskInfos_out.push_back(diskInfo);
	}
	return FUNCTION_RETURN::FUNC_RET_OK;
}